

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O1

void __thiscall
QAccessibleTextWidget::setSelection
          (QAccessibleTextWidget *this,int selectionIndex,int startOffset,int endOffset)

{
  int iVar1;
  long in_FS_OFFSET;
  QTextCursor cursor;
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (selectionIndex == 0) {
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x158))((QTextCursor *)&local_30,this);
    iVar1 = (int)(QTextCursor *)&local_30;
    QTextCursor::setPosition(iVar1,startOffset);
    QTextCursor::setPosition(iVar1,endOffset);
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x160))(this,(QTextCursor *)&local_30);
    QTextCursor::~QTextCursor((QTextCursor *)&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAccessibleTextWidget::setSelection(int selectionIndex, int startOffset, int endOffset)
{
    if (selectionIndex != 0)
        return;

    QTextCursor cursor = textCursor();
    cursor.setPosition(startOffset, QTextCursor::MoveAnchor);
    cursor.setPosition(endOffset, QTextCursor::KeepAnchor);
    setTextCursor(cursor);
}